

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O1

_Bool gen_store(DisasContext_conflict12 *ctx,arg_sb *a,MemOp memop)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  TCGOpcode TVar2;
  uintptr_t o_3;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c7aabd:
    tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[a->rs1] != ret) {
    pTVar1 = s->cpu_gpr[a->rs1] + (long)s;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c7aabd;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)s);
  tcg_gen_addi_i64_riscv64(s,ret,ret,(long)a->imm);
  if ((long)a->rs2 == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs2] == pTVar1) goto LAB_00c7ab13;
    a2 = s->cpu_gpr[a->rs2] + (long)s;
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,TVar2,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c7ab13:
  tcg_gen_qemu_st_i64_riscv64(s,pTVar1,ret,(ulong)ctx->mem_idx,memop);
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar1 + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_store(DisasContext *ctx, arg_sb *a, MemOp memop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv dat = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);
    tcg_gen_addi_tl(tcg_ctx, t0, t0, a->imm);
    gen_get_gpr(tcg_ctx, dat, a->rs2);

    tcg_gen_qemu_st_tl(tcg_ctx, dat, t0, ctx->mem_idx, memop);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, dat);
    return true;
}